

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackDebGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackDebGenerator *this,string *componentName)

{
  char *pcVar1;
  allocator local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string groupVar;
  allocator local_21;
  string *local_20;
  string *componentName_local;
  cmCPackDebGenerator *this_local;
  
  local_20 = componentName;
  componentName_local = (string *)this;
  this_local = (cmCPackDebGenerator *)__return_storage_ptr__;
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ALL_COMPONENTS_IN_ONE",&local_21)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_98,componentName);
    std::operator+(&local_78,"CPACK_COMPONENT_",&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_78,"_GROUP");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_58);
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
    }
    else {
      pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_99);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackDebGenerator::GetComponentInstallDirNameSuffix(
    const std::string& componentName)
  {
  if (componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    return componentName;
  }

  if (componentPackageMethod == ONE_PACKAGE) {
    return std::string("ALL_COMPONENTS_IN_ONE");
  }
  // We have to find the name of the COMPONENT GROUP
  // the current COMPONENT belongs to.
  std::string groupVar = "CPACK_COMPONENT_" +
        cmSystemTools::UpperCase(componentName) + "_GROUP";
    if (NULL != GetOption(groupVar))
      {
      return std::string(GetOption(groupVar));
      }
    else
      {
      return componentName;
      }
  }